

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O2

void __thiscall
kj::_::
Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>>>
::Tuple<kj::HttpClient::ConnectRequest::Status,kj::Exception>
          (Tuple<kj::Promise<kj::HttpClient::ConnectRequest::Status>,kj::Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>>>
           *this,Tuple<kj::HttpClient::ConnectRequest::Status,_kj::Exception> *other)

{
  Own<kj::_::ImmediateBrokenPromiseNode,_kj::_::PromiseDisposer> OVar1;
  Own<kj::_::ImmediateBrokenPromiseNode,_kj::_::PromiseDisposer> local_70;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_68;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_60;
  Status local_58;
  
  HttpClient::ConnectRequest::Status::Status(&local_58,(Status *)other);
  Promise<kj::HttpClient::ConnectRequest::Status>::Promise
            ((Promise<kj::HttpClient::ConnectRequest::Status> *)&local_68,&local_58);
  *(PromiseNode **)this = local_68.ptr;
  local_68.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_68);
  HttpClient::ConnectRequest::Status::~Status(&local_58);
  PromiseDisposer::alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
            ((PromiseDisposer *)&local_70,&(other->impl).super_TupleElement<1U,_kj::Exception>.value
            );
  OVar1.ptr = local_70.ptr;
  local_70.ptr = (ImmediateBrokenPromiseNode *)0x0;
  local_60.ptr = (PromiseNode *)OVar1.ptr;
  local_68.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_68);
  Own<kj::_::ImmediateBrokenPromiseNode,_kj::_::PromiseDisposer>::dispose(&local_70);
  *(ImmediateBrokenPromiseNode **)(this + 8) = OVar1.ptr;
  local_60.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_60);
  return;
}

Assistant:

constexpr inline Tuple(Tuple<U...>&& other): impl(kj::mv(other)) {}